

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_internal.h
# Opt level: O2

int mbedtls_ssl_safer_memcmp(void *a,void *b,size_t n)

{
  size_t sVar1;
  byte bVar2;
  
  bVar2 = 0;
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    bVar2 = bVar2 | *(byte *)((long)b + sVar1) ^ *(byte *)((long)a + sVar1);
  }
  return (int)bVar2;
}

Assistant:

static inline int mbedtls_ssl_safer_memcmp( const void *a, const void *b, size_t n )
{
    size_t i;
    const unsigned char *A = (const unsigned char *) a;
    const unsigned char *B = (const unsigned char *) b;
    unsigned char diff = 0;

    for( i = 0; i < n; i++ )
        diff |= A[i] ^ B[i];

    return( diff );
}